

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Escape::CGraph::print(CGraph *this,FILE *f)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  fprintf((FILE *)f,"nVertices=%lld nEdges=%lld\n",this->nVertices,this->nEdges);
  if (0 < this->nVertices) {
    lVar1 = 0;
    do {
      fprintf((FILE *)f,"%lld: ",lVar1);
      lVar3 = this->offsets[lVar1];
      lVar2 = lVar1 + 1;
      if (lVar3 < this->offsets[lVar1 + 1]) {
        do {
          fprintf((FILE *)f,"%lld ",this->nbors[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < this->offsets[lVar2]);
      }
      fputc(10,(FILE *)f);
      lVar1 = lVar2;
    } while (lVar2 < this->nVertices);
  }
  return;
}

Assistant:

void CGraph::print(FILE *f) const {
    fprintf(f, "nVertices=%lld nEdges=%lld\n", (int64_t) nVertices, (int64_t) nEdges);
    for (VertexIdx i = 0; i < nVertices; ++i) {
        fprintf(f, "%lld: ", (int64_t) i);
        for (EdgeIdx j = offsets[i]; j < offsets[i + 1]; ++j)
            fprintf(f, "%lld ", (int64_t) nbors[j]);
        fprintf(f, "\n");
    }
}